

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O0

ClauseGenerationResult __thiscall
Inferences::CompositeSGI::generateSimplify(CompositeSGI *this,Clause *cl)

{
  Stack<Lib::VirtualIterator<Kernel::Clause_*>_> *this_00;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  long in_RSI;
  ClauseIterator in_RDI;
  ClauseGenerationResult CVar1;
  GeneratingInferenceEngine *gen;
  GeneratingInferenceEngine **__end2;
  GeneratingInferenceEngine **__begin2;
  Stack<Inferences::GeneratingInferenceEngine_*> *__range2;
  ClauseGenerationResult res;
  SimplifyingGeneratingInference *simpl;
  SimplifyingGeneratingInference **__end1;
  SimplifyingGeneratingInference **__begin1;
  Stack<Inferences::SimplifyingGeneratingInference_*> *__range1;
  Stack<Lib::VirtualIterator<Kernel::Clause_*>_> clauses;
  bool redundant;
  FlatteningIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>_>
  *in_stack_fffffffffffffe90;
  FlatteningIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>_>
  *in_stack_fffffffffffffe98;
  Stack<Lib::VirtualIterator<Kernel::Clause_*>_> *in_stack_fffffffffffffea0;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>
  *in_stack_fffffffffffffee8;
  FlatteningIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>_>
  *in_stack_fffffffffffffef8;
  undefined1 local_b8 [8];
  IteratorCore<Kernel::Clause_*> *local_b0;
  FlatteningIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>_>
  *local_a8;
  FlatteningIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>_>
  *local_a0;
  Stack<Inferences::GeneratingInferenceEngine_*> *local_98;
  int local_8c;
  VirtualIterator<Kernel::Clause_*> local_88;
  VirtualIterator<Kernel::Clause_*> local_80;
  byte local_78;
  SimplifyingGeneratingInference *local_70;
  Stack<Lib::VirtualIterator<Kernel::Clause_*>_> *local_68;
  Stack<Lib::VirtualIterator<Kernel::Clause_*>_> *local_50;
  Stack<Inferences::SimplifyingGeneratingInference_*> *local_48;
  byte local_19;
  undefined8 local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  Lib::Stack<Lib::VirtualIterator<Kernel::Clause_*>_>::Stack
            (in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
  local_48 = (Stack<Inferences::SimplifyingGeneratingInference_*> *)(in_RSI + 0x10);
  local_50 = (Stack<Lib::VirtualIterator<Kernel::Clause_*>_> *)
             Lib::Stack<Inferences::SimplifyingGeneratingInference_*>::begin(local_48);
  this_00 = (Stack<Lib::VirtualIterator<Kernel::Clause_*>_> *)
            Lib::Stack<Inferences::SimplifyingGeneratingInference_*>::end(local_48);
  local_68 = this_00;
  for (; local_50 != local_68;
      local_50 = (Stack<Lib::VirtualIterator<Kernel::Clause_*>_> *)&local_50->_stack) {
    local_70 = (SimplifyingGeneratingInference *)local_50->_capacity;
    (*(local_70->super_InferenceEngine)._vptr_InferenceEngine[5])(&local_80,local_70,local_18);
    Lib::VirtualIterator<Kernel::Clause_*>::VirtualIterator(&local_88,&local_80);
    Lib::Stack<Lib::VirtualIterator<Kernel::Clause_*>_>::push
              (this_00,(VirtualIterator<Kernel::Clause_*> *)in_stack_fffffffffffffe98);
    Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
              ((VirtualIterator<Kernel::Clause_*> *)in_stack_fffffffffffffe90);
    if ((local_78 & 1) == 0) {
      local_8c = 0;
    }
    else {
      local_19 = 1;
      local_8c = 2;
    }
    SimplifyingGeneratingInference::ClauseGenerationResult::~ClauseGenerationResult
              ((ClauseGenerationResult *)0x7f3235);
    if (local_8c != 0) break;
  }
  if ((local_19 & 1) == 0) {
    local_98 = (Stack<Inferences::GeneratingInferenceEngine_*> *)(in_RSI + 0x30);
    in_stack_fffffffffffffe98 =
         (FlatteningIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>_>
          *)Lib::Stack<Inferences::GeneratingInferenceEngine_*>::begin(local_98);
    local_a0 = in_stack_fffffffffffffe98;
    in_stack_fffffffffffffe90 =
         (FlatteningIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>_>
          *)Lib::Stack<Inferences::GeneratingInferenceEngine_*>::end(local_98);
    local_a8 = in_stack_fffffffffffffe90;
    for (; local_a0 != local_a8;
        local_a0 = (FlatteningIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>_>
                    *)&(local_a0->_master)._iter._func.a._stack) {
      local_b0 = (IteratorCore<Kernel::Clause_*> *)(local_a0->_master)._iter._func.a._capacity;
      (*(((SimplifyingGeneratingInference *)&local_b0->_vptr_IteratorCore)->super_InferenceEngine).
        _vptr_InferenceEngine[6])(local_b8,local_b0,local_18);
      Lib::Stack<Lib::VirtualIterator<Kernel::Clause_*>_>::push
                (this_00,(VirtualIterator<Kernel::Clause_*> *)in_stack_fffffffffffffe98);
      Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
                ((VirtualIterator<Kernel::Clause_*> *)in_stack_fffffffffffffe90);
    }
  }
  Lib::arrayIter<Lib::Stack<Lib::VirtualIterator<Kernel::Clause*>>>
            ((Stack<Lib::VirtualIterator<Kernel::Clause_*>_> *)in_stack_fffffffffffffe98);
  Lib::
  getFlattenedIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Lib::VirtualIterator<Kernel::Clause*>>,unsigned_long>(Lib::Stack<Lib::VirtualIterator<Kernel::Clause*>>&&,unsigned_long)::_lambda(auto:1)_1_,Lib::VirtualIterator<Kernel::Clause*>>>>
            (in_stack_fffffffffffffee8);
  Lib::
  pvi<Lib::FlatteningIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Lib::VirtualIterator<Kernel::Clause*>>,unsigned_long>(Lib::Stack<Lib::VirtualIterator<Kernel::Clause*>>&&,unsigned_long)::_lambda(auto:1)_1_,Lib::VirtualIterator<Kernel::Clause*>>>>>
            (in_stack_fffffffffffffef8);
  *(byte *)&(in_RDI._core)->_refCnt = local_19 & 1;
  Lib::
  FlatteningIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>_>
  ::~FlatteningIterator(in_stack_fffffffffffffe90);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>
  ::~IterTraits((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>
                 *)0x7f33e7);
  local_8c = 1;
  Lib::Stack<Lib::VirtualIterator<Kernel::Clause_*>_>::~Stack
            ((Stack<Lib::VirtualIterator<Kernel::Clause_*>_> *)in_stack_fffffffffffffe90);
  CVar1._8_8_ = extraout_RDX;
  CVar1.clauses._core = in_RDI._core;
  return CVar1;
}

Assistant:

CompositeSGI::ClauseGenerationResult CompositeSGI::generateSimplify(Kernel::Clause* cl)
{
  auto redundant = false;
  Stack<ClauseIterator> clauses;
  /* apply generations as until a redundancy is discovered */
  for (auto simpl : _simplifiers) {
    auto res = simpl->generateSimplify(cl);
    clauses.push(res.clauses);
    if (res.premiseRedundant) {
      redundant = true;
      break;
    }
  }
  if (!redundant) {
    /* apply strictly generating rules if there hasn't been a redundancy */
    for (auto gen : _generators) {
      clauses.push(gen->generateClauses(cl));
    }
  }
  return ClauseGenerationResult {
    .clauses          = pvi(getFlattenedIterator(arrayIter(std::move(clauses)))),
    .premiseRedundant = redundant,
  };
}